

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-randart.c
# Opt level: O2

wchar_t get_base_item_tval(artifact_set_data *data)

{
  int iVar1;
  uint32_t uVar2;
  wchar_t wVar3;
  int *piVar4;
  
  uVar2 = Rand_div(data->tv_freq[0x23]);
  wVar3 = L'\xffffffff';
  piVar4 = data->tv_freq;
  do {
    wVar3 = wVar3 + L'\x01';
    iVar1 = *piVar4;
    piVar4 = piVar4 + 1;
  } while (iVar1 <= (int)uVar2);
  return wVar3;
}

Assistant:

static int get_base_item_tval(struct artifact_set_data *data)
{
	int tval = 0;
	int r = randint1(data->tv_freq[TV_MAX - 1]);

	/* Get a tval based on original artifact tval frequencies */
	while (r > data->tv_freq[tval]) {
		tval++;
	}

	return tval;
}